

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O1

void anon_unknown.dwarf_bd06::verifyPixelsAreEqual<half>
               (FlatImageChannel *c1,FlatImageChannel *c2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  ImageLevel *pIVar5;
  int y;
  ImageChannel *this;
  ImageChannel *this_00;
  ArgExc *this_01;
  int x;
  int x_00;
  
  this = (ImageChannel *)
         __dynamic_cast(c1,&Imf_2_5::FlatImageChannel::typeinfo,
                        &Imf_2_5::TypedFlatImageChannel<half>::typeinfo,0);
  if (this != (ImageChannel *)0x0) {
    this_00 = (ImageChannel *)
              __dynamic_cast(c2,&Imf_2_5::FlatImageChannel::typeinfo,
                             &Imf_2_5::TypedFlatImageChannel<half>::typeinfo,0);
    if (this_00 != (ImageChannel *)0x0) {
      pIVar5 = (c1->super_ImageChannel)._level;
      y = (pIVar5->_dataWindow).min.y;
      if (y <= (pIVar5->_dataWindow).max.y) {
        iVar3 = (c1->super_ImageChannel)._xSampling;
        iVar4 = (c1->super_ImageChannel)._ySampling;
        do {
          x = (pIVar5->_dataWindow).min.x;
          if (x <= (pIVar5->_dataWindow).max.x) {
            do {
              Imf_2_5::ImageChannel::boundsCheck(this,x,y);
              fVar2 = *(float *)((long)&half::_toFloat +
                                (ulong)*(ushort *)
                                        ((long)&(this[1]._level)->_vptr_ImageLevel +
                                        (long)(x / this->_xSampling +
                                              (y / this->_ySampling) * this->_pixelsPerRow) * 2) * 4
                                );
              x_00 = dx + x;
              Imf_2_5::ImageChannel::boundsCheck(this_00,x_00,dy + y);
              pfVar1 = (float *)((long)&half::_toFloat +
                                (ulong)*(ushort *)
                                        ((long)&(this_00[1]._level)->_vptr_ImageLevel +
                                        (long)(x_00 / this_00->_xSampling +
                                              ((dy + y) / this_00->_ySampling) *
                                              this_00->_pixelsPerRow) * 2) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                this_01 = (ArgExc *)
                          __cxa_allocate_exception
                                    (0x48,this_00[1]._level,
                                     (long)x_00 % (long)this_00->_xSampling & 0xffffffff);
                Iex_2_5::ArgExc::ArgExc(this_01,"different pixel values");
                __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              x = x + iVar3;
            } while (x <= (pIVar5->_dataWindow).max.x);
          }
          y = y + iVar4;
        } while (y <= (pIVar5->_dataWindow).max.y);
      }
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void
verifyPixelsAreEqual
    (const FlatImageChannel &c1,
     const FlatImageChannel &c2,
     int dx,
     int dy)
{
    const TypedFlatImageChannel<T> &tc1 =
        dynamic_cast <const TypedFlatImageChannel<T>&> (c1);

    const TypedFlatImageChannel<T> &tc2 =
        dynamic_cast <const TypedFlatImageChannel<T>&> (c2);

    const Box2i &dataWindow = c1.level().dataWindow();
    int xStep = c1.xSampling();
    int yStep = c1.ySampling();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += yStep)
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; x += xStep)
            if (tc1.at (x, y) != tc2.at (x + dx, y + dy))
                throw ArgExc ("different pixel values");
}